

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

filtration_algorithm_t * get_custom_filtration_computer(string *algorithm)

{
  int iVar1;
  filtration_algorithm_t *pfVar2;
  undefined **ppuVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)algorithm);
  if (iVar1 == 0) {
    ppuVar3 = &PTR__filtration_algorithm_t_0012c6f0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)algorithm);
    if (iVar1 == 0) {
      ppuVar3 = &PTR__filtration_algorithm_t_0012c758;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)algorithm);
      if (iVar1 == 0) {
        ppuVar3 = &PTR__filtration_algorithm_t_0012c7b0;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)algorithm);
        if (iVar1 == 0) {
          ppuVar3 = &PTR__filtration_algorithm_t_0012c808;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)algorithm);
          if (iVar1 == 0) {
            ppuVar3 = &PTR__filtration_algorithm_t_0012c860;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)algorithm);
            if (iVar1 == 0) {
              ppuVar3 = &PTR__filtration_algorithm_t_0012c8b8;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)algorithm);
              if (iVar1 == 0) {
                ppuVar3 = &PTR__filtration_algorithm_t_0012c910;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)algorithm);
                if (iVar1 == 0) {
                  ppuVar3 = &PTR__filtration_algorithm_t_0012c968;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)algorithm);
                  if (iVar1 == 0) {
                    ppuVar3 = &PTR__filtration_algorithm_t_0012c9c0;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)algorithm);
                    if (iVar1 == 0) {
                      ppuVar3 = &PTR__filtration_algorithm_t_0012ca18;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)algorithm);
                      if (iVar1 != 0) {
                        return (filtration_algorithm_t *)0x0;
                      }
                      ppuVar3 = &PTR__filtration_algorithm_t_0012ca70;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pfVar2 = (filtration_algorithm_t *)operator_new(8);
  pfVar2->_vptr_filtration_algorithm_t = (_func_int **)ppuVar3;
  return pfVar2;
}

Assistant:

filtration_algorithm_t* get_custom_filtration_computer(std::string algorithm) {
	if (algorithm == "dimension") return new dimension_filtration();
	if (algorithm == "zero") return new zero_filtration();
	if (algorithm == "max") return new max_filtration();
	if (algorithm == "max3") return new max3_filtration();
	if (algorithm == "max_plus_one") return new max_plus_one_filtration();
	if (algorithm == "product") return new product_filtration();
	if (algorithm == "sum") return new sum_filtration();
	if (algorithm == "pmean") return new pmean_filtration();
	if (algorithm == "pmoment") return new pmoment_filtration();
	if (algorithm == "remove_edges") return new remove_edges_filtration();
	if (algorithm == "vertex_degree") return new vertex_degree_filtration();

	return nullptr;
}